

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

reference __thiscall
slang::SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdItem>::
emplace_back<slang::ast::RandSeqProductionSymbol::ProdItem_const&>
          (SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdItem> *this,ProdItem *args)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  size_type sVar3;
  ulong uVar4;
  pointer p;
  RandSeqProductionSymbol *pRVar5;
  size_t sVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  pointer pPVar10;
  pointer pPVar11;
  ProdBase PVar12;
  undefined4 uVar13;
  pointer pPVar14;
  long lVar15;
  long lVar16;
  pointer __src;
  ulong uVar17;
  long lVar18;
  
  __src = this->data_ + this->len;
  if (this->len != this->cap) {
    PVar12.kind = (args->super_ProdBase).kind;
    uVar13 = *(undefined4 *)&args->field_0x4;
    pRVar5 = args->target;
    sVar6 = (args->args)._M_extent._M_extent_value;
    (__src->args)._M_ptr = (args->args)._M_ptr;
    (__src->args)._M_extent._M_extent_value = sVar6;
    __src->super_ProdBase = (ProdBase)PVar12.kind;
    *(undefined4 *)&__src->field_0x4 = uVar13;
    __src->target = pRVar5;
    sVar3 = this->len;
    this->len = sVar3 + 1;
    return this->data_ + sVar3;
  }
  if (this->len == 0x3ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar17 = this->len + 1;
  uVar4 = this->cap;
  if (uVar17 < uVar4 * 2) {
    uVar17 = uVar4 * 2;
  }
  if (0x3ffffffffffffff - uVar4 < uVar4) {
    uVar17 = 0x3ffffffffffffff;
  }
  lVar18 = (long)__src - (long)this->data_;
  pPVar14 = (pointer)operator_new(uVar17 << 5);
  uVar7 = *(undefined8 *)args;
  pRVar5 = args->target;
  sVar6 = (args->args)._M_extent._M_extent_value;
  puVar1 = (undefined8 *)((long)pPVar14 + lVar18 + 0x10);
  *puVar1 = (args->args)._M_ptr;
  puVar1[1] = sVar6;
  *(undefined8 *)((long)pPVar14 + lVar18) = uVar7;
  ((undefined8 *)((long)pPVar14 + lVar18))[1] = pRVar5;
  p = this->data_;
  lVar15 = this->len * 0x20;
  lVar16 = (long)p + (lVar15 - (long)__src);
  pPVar10 = p;
  pPVar11 = pPVar14;
  if (lVar16 == 0) {
    if (this->len != 0) {
      lVar16 = 0;
      do {
        puVar1 = (undefined8 *)((long)&(p->super_ProdBase).kind + lVar16);
        uVar7 = *puVar1;
        uVar8 = puVar1[1];
        puVar1 = (undefined8 *)((long)&(p->args)._M_ptr + lVar16);
        uVar9 = puVar1[1];
        puVar2 = (undefined8 *)((long)&(pPVar14->args)._M_ptr + lVar16);
        *puVar2 = *puVar1;
        puVar2[1] = uVar9;
        puVar1 = (undefined8 *)((long)&(pPVar14->super_ProdBase).kind + lVar16);
        *puVar1 = uVar7;
        puVar1[1] = uVar8;
        lVar16 = lVar16 + 0x20;
      } while (lVar15 != lVar16);
    }
  }
  else {
    for (; pPVar10 != __src; pPVar10 = pPVar10 + 1) {
      PVar12.kind = (pPVar10->super_ProdBase).kind;
      uVar13 = *(undefined4 *)&pPVar10->field_0x4;
      pRVar5 = pPVar10->target;
      sVar6 = (pPVar10->args)._M_extent._M_extent_value;
      (pPVar11->args)._M_ptr = (pPVar10->args)._M_ptr;
      (pPVar11->args)._M_extent._M_extent_value = sVar6;
      pPVar11->super_ProdBase = (ProdBase)PVar12.kind;
      *(undefined4 *)&pPVar11->field_0x4 = uVar13;
      pPVar11->target = pRVar5;
      pPVar11 = pPVar11 + 1;
    }
    memcpy((void *)((long)pPVar14 + lVar18 + 0x20),__src,
           (lVar16 - 0x20U & 0xffffffffffffffe0) + 0x20);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
  }
  this->len = this->len + 1;
  this->cap = uVar17;
  this->data_ = pPVar14;
  return (reference)((long)pPVar14 + lVar18);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }